

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ServiceDescriptorTest_Name_Test::
~ServiceDescriptorTest_Name_Test(ServiceDescriptorTest_Name_Test *this)

{
  ServiceDescriptorTest::~ServiceDescriptorTest(&this->super_ServiceDescriptorTest);
  operator_delete(this,0xf8);
  return;
}

Assistant:

TEST_F(ServiceDescriptorTest, Name) {
  EXPECT_EQ("TestService", service_->name());
  EXPECT_EQ("TestService", service_->full_name());
  EXPECT_EQ(foo_file_, service_->file());

  EXPECT_EQ("TestService2", service2_->name());
  EXPECT_EQ("corge.grault.TestService2", service2_->full_name());
  EXPECT_EQ(bar_file_, service2_->file());
}